

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_range_join.cpp
# Opt level: O2

TaskExecutionResult __thiscall
duckdb::RangeJoinMergeTask::ExecuteTask(RangeJoinMergeTask *this,TaskExecutionMode mode)

{
  GlobalSortedTable *pGVar1;
  BufferManager *buffer_manager;
  Event *this_00;
  MergeSorter merge_sorter;
  MergeSorter MStack_58;
  
  pGVar1 = this->table;
  buffer_manager = BufferManager::GetBufferManager(this->context);
  MergeSorter::MergeSorter(&MStack_58,&pGVar1->global_sort_state,buffer_manager);
  MergeSorter::PerformInMergeRound(&MStack_58);
  this_00 = shared_ptr<duckdb::Event,_true>::operator->(&(this->super_ExecutorTask).event);
  Event::FinishTask(this_00);
  MergeSorter::~MergeSorter(&MStack_58);
  return TASK_FINISHED;
}

Assistant:

TaskExecutionResult ExecuteTask(TaskExecutionMode mode) override {
		// Initialize iejoin sorted and iterate until done
		auto &global_sort_state = table.global_sort_state;
		MergeSorter merge_sorter(global_sort_state, BufferManager::GetBufferManager(context));
		merge_sorter.PerformInMergeRound();
		event->FinishTask();

		return TaskExecutionResult::TASK_FINISHED;
	}